

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O0

void BinarySink_put_mp_ssh2_from_string(BinarySink *bs,ptrlen str)

{
  bool bVar1;
  unsigned_long local_30;
  size_t nbytes;
  uchar *bytes;
  BinarySink *bs_local;
  ptrlen str_local;
  
  local_30 = str.len;
  nbytes = (size_t)str.ptr;
  while( true ) {
    bVar1 = false;
    if (local_30 != 0) {
      bVar1 = *(char *)nbytes == '\0';
    }
    if (!bVar1) break;
    local_30 = local_30 - 1;
    nbytes = nbytes + 1;
  }
  if ((local_30 == 0) || ((*(byte *)nbytes & 0x80) == 0)) {
    BinarySink_put_uint32(bs->binarysink_,local_30);
  }
  else {
    BinarySink_put_uint32(bs->binarysink_,local_30 + 1);
    BinarySink_put_byte(bs->binarysink_,'\0');
  }
  BinarySink_put_data(bs->binarysink_,(void *)nbytes,local_30);
  return;
}

Assistant:

void BinarySink_put_mp_ssh2_from_string(BinarySink *bs, ptrlen str)
{
    const unsigned char *bytes = (const unsigned char *)str.ptr;
    size_t nbytes = str.len;
    while (nbytes > 0 && bytes[0] == 0) {
        nbytes--;
        bytes++;
    }
    if (nbytes > 0 && bytes[0] & 0x80) {
        put_uint32(bs, nbytes + 1);
        put_byte(bs, 0);
    } else {
        put_uint32(bs, nbytes);
    }
    put_data(bs, bytes, nbytes);
}